

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_add_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  bcf_hrec_t *pbVar1;
  char *__s2;
  uint uVar2;
  int iVar3;
  bcf_hrec_t **ppbVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar2 = 0;
  if (hrec != (bcf_hrec_t *)0x0) {
    hrec->type = 5;
    iVar3 = bcf_hdr_register_hrec(hdr,hrec);
    if (iVar3 == 0) {
      if (hrec->type != 5) {
LAB_00118ea6:
        bcf_hrec_destroy(hrec);
        return 0;
      }
      uVar5 = (ulong)hdr->nhrec;
      bVar7 = 0 < (long)uVar5;
      if (0 < (long)uVar5) {
        ppbVar4 = hdr->hrec;
        uVar6 = 1;
        do {
          pbVar1 = ppbVar4[uVar6 - 1];
          if (pbVar1->type == 5) {
            __s2 = hrec->key;
            iVar3 = strcmp(pbVar1->key,__s2);
            if ((iVar3 == 0) &&
               ((iVar3 = strcmp(__s2,"fileformat"), iVar3 == 0 ||
                (iVar3 = strcmp(pbVar1->value,hrec->value), iVar3 == 0)))) {
              if (bVar7) goto LAB_00118ea6;
              break;
            }
          }
          bVar7 = uVar6 < uVar5;
          bVar8 = uVar6 != uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
    }
    iVar3 = hdr->nhrec;
    hdr->nhrec = iVar3 + 1;
    ppbVar4 = (bcf_hrec_t **)realloc(hdr->hrec,(long)iVar3 * 8 + 8);
    hdr->hrec = ppbVar4;
    ppbVar4[iVar3] = hrec;
    hdr->dirty = 1;
    uVar2 = (uint)(hrec->type != 5);
  }
  return uVar2;
}

Assistant:

int bcf_hdr_add_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    if ( !hrec ) return 0;

    hrec->type = BCF_HL_GEN;
    if ( !bcf_hdr_register_hrec(hdr,hrec) )
    {
        // If one of the hashed field, then it is already present
        if ( hrec->type != BCF_HL_GEN )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }

        // Is one of the generic fields and already present?
        int i;
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=BCF_HL_GEN ) continue;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hrec->key,"fileformat") ) break;
            if ( !strcmp(hdr->hrec[i]->key,hrec->key) && !strcmp(hdr->hrec[i]->value,hrec->value) ) break;
        }
        if ( i<hdr->nhrec )
        {
            bcf_hrec_destroy(hrec);
            return 0;
        }
    }

    // New record, needs to be added
    int n = ++hdr->nhrec;
    hdr->hrec = (bcf_hrec_t**) realloc(hdr->hrec, n*sizeof(bcf_hrec_t*));
    hdr->hrec[n-1] = hrec;
    hdr->dirty = 1;

    return hrec->type==BCF_HL_GEN ? 0 : 1;
}